

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  ImGuiID IVar7;
  ImGuiWindow *pIVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *it;
  size_t sVar14;
  undefined8 extraout_RAX;
  char *pcVar15;
  bool *pbVar16;
  uint uVar17;
  ImGuiCol idx;
  bool is_contents_visible;
  float fVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar19;
  bool text_clipped;
  bool just_closed;
  uint local_e4;
  ImGuiContext *local_e0;
  ImGuiID local_d4;
  ImGuiTabItem *local_d0;
  ImVec2 local_c8;
  ImGuiWindow *local_c0;
  uint local_b4;
  ImDrawList *local_b0;
  bool hovered;
  undefined7 uStack_a7;
  float fStack_a4;
  bool held;
  float local_9c;
  undefined1 local_98 [4];
  undefined1 auStack_94 [12];
  char *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar6 = GImGui;
  local_c0 = GImGui->CurrentWindow;
  if (local_c0->SkipItems != false) {
    return false;
  }
  local_d4 = TabBarCalcTabID(tab_bar,label);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      PushItemFlag(0x18,true);
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,local_d4,(ImRect *)0x0,0);
      PopItemFlag();
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x1e3d,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)")
      ;
    }
  }
  local_e0 = pIVar6;
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1e3e,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  pbVar16 = (bool *)0x0;
  uVar17 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar16 = p_open;
    uVar17 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar17 = flags;
  }
  IVar19 = TabItemCalcSize(label,pbVar16 != (bool *)0x0);
  IVar7 = local_d4;
  unique0x10000197 = extraout_XMM0_Dc;
  local_98 = (undefined1  [4])IVar19.x;
  auStack_94._0_4_ = IVar19.y;
  unique0x1000019b = extraout_XMM0_Dd;
  it = TabBarFindTabByID(tab_bar,local_d4);
  local_b0 = (ImDrawList *)it;
  local_80 = label;
  if (it == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = -NAN;
    bb.Max.y = -NAN;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    it = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
    it->ID = IVar7;
    it->Width = (float)local_98;
    tab_bar->TabsAddedNew = true;
  }
  iVar12 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
  pcVar9 = local_80;
  tab_bar->LastTabItemIdx = (ImS16)iVar12;
  it->ContentWidth = (float)local_98;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  it->BeginOrder = sVar3;
  local_b4 = tab_bar->Flags;
  local_c8.x = (float)(tab_bar->PrevFrameVisible + 1);
  local_6c = local_e0->FrameCount;
  local_70 = it->LastFrameVisible + 1;
  it->LastFrameVisible = local_6c;
  it->Flags = uVar17;
  iVar12 = (tab_bar->TabsNames).Buf.Size;
  iVar13 = iVar12 + -1;
  if (iVar12 == 0) {
    iVar13 = 0;
  }
  it->NameOffset = iVar13;
  local_d0 = it;
  sVar14 = strlen(local_80);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar9,pcVar9 + sVar14 + 1);
  IVar7 = local_d4;
  if (((local_70 < local_6c) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if ((int)local_c8.x < local_6c) {
      if ((uVar17 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_0014704b;
    }
    else if ((uVar17 >> 0x15 & 1) == 0) {
LAB_0014704b:
      tab_bar->NextSelectedTabId = local_d4;
    }
  }
  if ((((uVar17 & 2) != 0) && (tab_bar->SelectedTabId != local_d4)) && ((uVar17 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = local_d4;
  }
  if (tab_bar->VisibleTabId == local_d4) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_c8.x < local_6c) &&
          ((tab_bar->Tabs).Size == 1)) {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((local_70 < local_6c) && (local_b0 == (ImDrawList *)0x0 || local_6c <= (int)local_c8.x)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,IVar7,(ImRect *)0x0,0);
    PopItemFlag();
    return (bool)((uVar17 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == local_d4) {
    local_d0->LastFrameSelected = local_e0->FrameCount;
  }
  uVar4 = local_d0->Flags;
  fVar2 = local_d0->Width;
  fVar18 = local_d0->Offset;
  if ((uVar4 & 0xc0) == 0) {
    fVar18 = (float)(int)(fVar18 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar18 + (tab_bar->BarRect).Min.x;
  local_c8 = (local_c0->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar19.y = bb.Min.y;
  IVar19.x = bb.Min.x;
  (local_c0->DC).CursorPos = IVar19;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_94._0_4_ + bb.Min.y;
  local_e4 = uVar17;
  if ((uVar4 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001471ab;
    fStack_a4 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_9c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_98 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001471ab:
    auVar5._12_4_ = 0;
    auVar5._0_12_ = auStack_94;
    _local_98 = auVar5 << 0x20;
  }
  pIVar8 = local_c0;
  pIVar6 = local_e0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_a4 = bb.Max.y - bb.Min.y;
  IVar19 = (local_c0->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_e0->Style).FramePadding.y);
  (pIVar8->DC).CursorMaxPos = IVar19;
  bVar10 = ItemAdd(&bb,IVar7,(ImRect *)0x0,0);
  if (!bVar10) {
    if (local_98[0] != '\0') {
      PopClipRect();
    }
    (local_c0->DC).CursorPos = local_c8;
    return is_contents_visible;
  }
  uVar17 = local_e4 & 0x200000;
  bVar10 = ButtonBehavior(&bb,IVar7,&hovered,&held,
                          (uVar17 >> 0x11) + (uint)pIVar6->DragDropActive * 0x200 + 0x1010);
  if ((bVar10) && (uVar17 == 0)) {
    tab_bar->NextSelectedTabId = IVar7;
  }
  hovered = (bool)(hovered | local_e0->HoveredId == IVar7);
  local_74 = uVar17;
  if (local_e0->ActiveId != IVar7) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_6c <= local_70)) && (bVar11 = IsMouseDragging(0,-1.0), bVar11)) &&
      ((local_e0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (local_e0->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(local_e0->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (local_e0->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,local_d0,(local_e0->IO).MousePos);
  }
  pcVar9 = local_80;
  local_b0 = local_c0->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_b4 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_b4 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_b0,&bb,local_e4,col);
  RenderNavHighlight(&bb,IVar7,1);
  bVar11 = IsItemHovered(8);
  if (bVar11) {
    bVar11 = IsMouseClicked(1,false);
    if (bVar11) {
      uVar17 = local_e4 >> 0x15 & 1;
    }
    else {
      bVar11 = IsMouseReleased(1);
      uVar17 = local_74;
      if (!bVar11) goto LAB_0014746b;
    }
    if (uVar17 == 0) {
      tab_bar->NextSelectedTabId = IVar7;
    }
  }
LAB_0014746b:
  uVar17 = (uint)tab_bar->Flags >> 1 & 4 | local_e4;
  if (pbVar16 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,IVar7);
  }
  TabItemLabelAndCloseButton
            (local_b0,&bb,uVar17,tab_bar->FramePadding,pcVar9,IVar7,close_button_id,
             is_contents_visible,&just_closed,&text_clipped);
  if ((pbVar16 != (bool *)0x0) && (just_closed != false)) {
    *pbVar16 = false;
    TabBarCloseTab(tab_bar,local_d0);
  }
  if (local_98[0] != '\0') {
    PopClipRect();
  }
  uVar17 = local_e4;
  (local_c0->DC).CursorPos = local_c8;
  if ((((text_clipped == true) && (local_e0->HoveredId == IVar7)) && (held == false)) &&
     (((local_e0->TooltipSlowDelay <= local_e0->HoveredIdNotActiveTimer &&
        local_e0->HoveredIdNotActiveTimer != local_e0->TooltipSlowDelay &&
       (bVar11 = IsItemHovered(0), bVar11)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((local_d0->Flags & 0x10) == 0)))))) {
    pcVar15 = FindRenderedTextEnd(pcVar9,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar15 - (int)pcVar9),pcVar9);
  }
  if (((uVar17 >> 0x15 & 1) != 0) &&
     (is_contents_visible = bVar10, tab_bar->SelectedTabId == local_d0->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1ef3,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return is_contents_visible;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}